

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

int secp256k1_musig_pubkey_agg
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_pubkey **pubkeys,size_t n_pubkeys
              )

{
  secp256k1_pubkey *pubkey;
  int iVar1;
  long lVar2;
  long lVar3;
  secp256k1_ge *psVar4;
  void *pvVar5;
  secp256k1_ge *psVar6;
  secp256k1_keyagg_cache_internal *psVar7;
  uint64_t *puVar8;
  char *pcVar9;
  size_t sVar10;
  byte bVar11;
  secp256k1_ge pkp;
  secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
  secp256k1_ge pk;
  uint64_t local_160 [11];
  uchar local_108 [8];
  uchar auStack_100 [8];
  uchar local_f8 [8];
  uchar auStack_f0 [8];
  uint64_t local_e8;
  uint64_t uStack_e0;
  uint64_t local_d8;
  uint64_t uStack_d0;
  undefined8 local_c8;
  secp256k1_gej pkj;
  
  bVar11 = 0;
  if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
    agg_pk->data[0x30] = '\0';
    agg_pk->data[0x31] = '\0';
    agg_pk->data[0x32] = '\0';
    agg_pk->data[0x33] = '\0';
    agg_pk->data[0x34] = '\0';
    agg_pk->data[0x35] = '\0';
    agg_pk->data[0x36] = '\0';
    agg_pk->data[0x37] = '\0';
    agg_pk->data[0x38] = '\0';
    agg_pk->data[0x39] = '\0';
    agg_pk->data[0x3a] = '\0';
    agg_pk->data[0x3b] = '\0';
    agg_pk->data[0x3c] = '\0';
    agg_pk->data[0x3d] = '\0';
    agg_pk->data[0x3e] = '\0';
    agg_pk->data[0x3f] = '\0';
    agg_pk->data[0x20] = '\0';
    agg_pk->data[0x21] = '\0';
    agg_pk->data[0x22] = '\0';
    agg_pk->data[0x23] = '\0';
    agg_pk->data[0x24] = '\0';
    agg_pk->data[0x25] = '\0';
    agg_pk->data[0x26] = '\0';
    agg_pk->data[0x27] = '\0';
    agg_pk->data[0x28] = '\0';
    agg_pk->data[0x29] = '\0';
    agg_pk->data[0x2a] = '\0';
    agg_pk->data[0x2b] = '\0';
    agg_pk->data[0x2c] = '\0';
    agg_pk->data[0x2d] = '\0';
    agg_pk->data[0x2e] = '\0';
    agg_pk->data[0x2f] = '\0';
    agg_pk->data[0x10] = '\0';
    agg_pk->data[0x11] = '\0';
    agg_pk->data[0x12] = '\0';
    agg_pk->data[0x13] = '\0';
    agg_pk->data[0x14] = '\0';
    agg_pk->data[0x15] = '\0';
    agg_pk->data[0x16] = '\0';
    agg_pk->data[0x17] = '\0';
    agg_pk->data[0x18] = '\0';
    agg_pk->data[0x19] = '\0';
    agg_pk->data[0x1a] = '\0';
    agg_pk->data[0x1b] = '\0';
    agg_pk->data[0x1c] = '\0';
    agg_pk->data[0x1d] = '\0';
    agg_pk->data[0x1e] = '\0';
    agg_pk->data[0x1f] = '\0';
    agg_pk->data[0] = '\0';
    agg_pk->data[1] = '\0';
    agg_pk->data[2] = '\0';
    agg_pk->data[3] = '\0';
    agg_pk->data[4] = '\0';
    agg_pk->data[5] = '\0';
    agg_pk->data[6] = '\0';
    agg_pk->data[7] = '\0';
    agg_pk->data[8] = '\0';
    agg_pk->data[9] = '\0';
    agg_pk->data[10] = '\0';
    agg_pk->data[0xb] = '\0';
    agg_pk->data[0xc] = '\0';
    agg_pk->data[0xd] = '\0';
    agg_pk->data[0xe] = '\0';
    agg_pk->data[0xf] = '\0';
  }
  if (pubkeys == (secp256k1_pubkey **)0x0) {
    pvVar5 = (ctx->illegal_callback).data;
    pcVar9 = "pubkeys != NULL";
  }
  else {
    if (n_pubkeys != 0) {
      ecmult_data.second_pk.infinity = 1;
      ecmult_data.second_pk.x.n[0] = 0;
      ecmult_data.second_pk.x.n[1] = 0;
      ecmult_data.second_pk.x.n[2] = 0;
      ecmult_data.second_pk.x.n[3] = 0;
      ecmult_data.second_pk.x.n[4] = 0;
      ecmult_data.second_pk.y.n[0] = 0;
      ecmult_data.second_pk.y.n[1] = 0;
      ecmult_data.second_pk.y.n[2] = 0;
      ecmult_data.second_pk.y.n[3] = 0;
      ecmult_data.second_pk.y.n[4] = 0;
      sVar10 = 1;
      ecmult_data.ctx = ctx;
      ecmult_data.pks = pubkeys;
      do {
        if (n_pubkeys == sVar10) goto LAB_00108530;
        pubkey = pubkeys[sVar10];
        iVar1 = secp256k1_memcmp_var(*pubkeys,pubkey,0x40);
        sVar10 = sVar10 + 1;
      } while (iVar1 == 0);
      iVar1 = secp256k1_pubkey_load(ctx,&pk,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      psVar4 = &pk;
      psVar6 = &ecmult_data.second_pk;
      for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
        (psVar6->x).n[0] = (psVar4->x).n[0];
        psVar4 = (secp256k1_ge *)((long)psVar4 + (ulong)bVar11 * -0x10 + 8);
        psVar6 = (secp256k1_ge *)((long)psVar6 + (ulong)bVar11 * -0x10 + 8);
      }
LAB_00108530:
      pk.x.n[0] = 0xc8fff302b399d5e0;
      pk.x.n[1] = 0x7c5b7f16badac71;
      pk.x.n[2] = 0x2a72ecf89701e2ef;
      pk.x.n[3] = 0xab148a38201a4c7b;
      local_160[1] = 0x40;
      for (sVar10 = 0; n_pubkeys != sVar10; sVar10 = sVar10 + 1) {
        pkp.x.n[0] = 0x21;
        iVar1 = secp256k1_ec_pubkey_serialize
                          (ctx,(uchar *)&pkj,(size_t *)&pkp,pubkeys[sVar10],0x102);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_sha256_write((secp256k1_sha256 *)&pk,(uchar *)&pkj,0x21);
      }
      secp256k1_sha256_finalize((secp256k1_sha256 *)&pk,ecmult_data.pks_hash);
      iVar1 = secp256k1_ecmult_multi_var
                        (&ctx->error_callback,(secp256k1_scratch *)0x0,&pkj,(secp256k1_scalar *)0x0,
                         secp256k1_musig_pubkey_agg_callback,&ecmult_data,n_pubkeys);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_ge_set_gej(&pkp,&pkj);
      secp256k1_fe_impl_normalize_var(&pkp.y);
      if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
        lVar2 = 0xb;
        psVar4 = &pkp;
        psVar7 = (secp256k1_keyagg_cache_internal *)&pk;
        for (lVar3 = lVar2; lVar3 != 0; lVar3 = lVar3 + -1) {
          (psVar7->pk).x.n[0] = (psVar4->x).n[0];
          psVar4 = (secp256k1_ge *)((long)psVar4 + (ulong)bVar11 * -0x10 + 8);
          psVar7 = (secp256k1_keyagg_cache_internal *)((long)psVar7 + (ulong)bVar11 * -0x10 + 8);
        }
        psVar4 = &ecmult_data.second_pk;
        puVar8 = local_160;
        for (; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar8 = (psVar4->x).n[0];
          psVar4 = (secp256k1_ge *)((long)psVar4 + (ulong)bVar11 * -0x10 + 8);
          puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        }
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        local_108[0] = ecmult_data.pks_hash[0];
        local_108[1] = ecmult_data.pks_hash[1];
        local_108[2] = ecmult_data.pks_hash[2];
        local_108[3] = ecmult_data.pks_hash[3];
        local_108[4] = ecmult_data.pks_hash[4];
        local_108[5] = ecmult_data.pks_hash[5];
        local_108[6] = ecmult_data.pks_hash[6];
        local_108[7] = ecmult_data.pks_hash[7];
        auStack_100[0] = ecmult_data.pks_hash[8];
        auStack_100[1] = ecmult_data.pks_hash[9];
        auStack_100[2] = ecmult_data.pks_hash[10];
        auStack_100[3] = ecmult_data.pks_hash[0xb];
        auStack_100[4] = ecmult_data.pks_hash[0xc];
        auStack_100[5] = ecmult_data.pks_hash[0xd];
        auStack_100[6] = ecmult_data.pks_hash[0xe];
        auStack_100[7] = ecmult_data.pks_hash[0xf];
        local_f8[0] = ecmult_data.pks_hash[0x10];
        local_f8[1] = ecmult_data.pks_hash[0x11];
        local_f8[2] = ecmult_data.pks_hash[0x12];
        local_f8[3] = ecmult_data.pks_hash[0x13];
        local_f8[4] = ecmult_data.pks_hash[0x14];
        local_f8[5] = ecmult_data.pks_hash[0x15];
        local_f8[6] = ecmult_data.pks_hash[0x16];
        local_f8[7] = ecmult_data.pks_hash[0x17];
        auStack_f0[0] = ecmult_data.pks_hash[0x18];
        auStack_f0[1] = ecmult_data.pks_hash[0x19];
        auStack_f0[2] = ecmult_data.pks_hash[0x1a];
        auStack_f0[3] = ecmult_data.pks_hash[0x1b];
        auStack_f0[4] = ecmult_data.pks_hash[0x1c];
        auStack_f0[5] = ecmult_data.pks_hash[0x1d];
        auStack_f0[6] = ecmult_data.pks_hash[0x1e];
        auStack_f0[7] = ecmult_data.pks_hash[0x1f];
        secp256k1_keyagg_cache_save(keyagg_cache,(secp256k1_keyagg_cache_internal *)&pk);
      }
      if (agg_pk != (secp256k1_xonly_pubkey *)0x0) {
        secp256k1_extrakeys_ge_even_y(&pkp);
        secp256k1_ge_to_bytes(agg_pk->data,&pkp);
        return 1;
      }
      return 1;
    }
    pvVar5 = (ctx->illegal_callback).data;
    pcVar9 = "n_pubkeys > 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar9,pvVar5);
  return 0;
}

Assistant:

int secp256k1_musig_pubkey_agg(const secp256k1_context* ctx, secp256k1_xonly_pubkey *agg_pk, secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_pubkey * const* pubkeys, size_t n_pubkeys) {
    secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
    secp256k1_gej pkj;
    secp256k1_ge pkp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    if (agg_pk != NULL) {
        memset(agg_pk, 0, sizeof(*agg_pk));
    }
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(n_pubkeys > 0);

    ecmult_data.ctx = ctx;
    ecmult_data.pks = pubkeys;

    secp256k1_ge_set_infinity(&ecmult_data.second_pk);
    for (i = 1; i < n_pubkeys; i++) {
        if (secp256k1_memcmp_var(pubkeys[0], pubkeys[i], sizeof(*pubkeys[0])) != 0) {
            secp256k1_ge pk;
            if (!secp256k1_pubkey_load(ctx, &pk, pubkeys[i])) {
                return 0;
            }
            ecmult_data.second_pk = pk;
            break;
        }
    }

    if (!secp256k1_musig_compute_pks_hash(ctx, ecmult_data.pks_hash, pubkeys, n_pubkeys)) {
        return 0;
    }
    /* TODO: actually use optimized ecmult_multi algorithms by providing a
     * scratch space */
    if (!secp256k1_ecmult_multi_var(&ctx->error_callback, NULL, &pkj, NULL, secp256k1_musig_pubkey_agg_callback, (void *) &ecmult_data, n_pubkeys)) {
        /* In order to reach this line with the current implementation of
         * ecmult_multi_var one would need to provide a callback that can
         * fail. */
        return 0;
    }
    secp256k1_ge_set_gej(&pkp, &pkj);
    secp256k1_fe_normalize_var(&pkp.y);
    /* The resulting public key is infinity with negligible probability */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&pkp));
    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i = { 0 };
        cache_i.pk = pkp;
        cache_i.second_pk = ecmult_data.second_pk;
        memcpy(cache_i.pks_hash, ecmult_data.pks_hash, sizeof(cache_i.pks_hash));
        secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    }

    if (agg_pk != NULL) {
        secp256k1_extrakeys_ge_even_y(&pkp);
        secp256k1_xonly_pubkey_save(agg_pk, &pkp);
    }
    return 1;
}